

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

int hash_table_insert_value(unsigned_long hash,long value,hash_table_t *hash_table)

{
  hash_table_entry_t *phVar1;
  hash_table_entry_t *phVar2;
  hash_table_entry_t *phVar3;
  hash_table_entry_t *entry;
  size_t i;
  hash_table_entry_t *start_entry;
  size_t index;
  size_t start_index;
  hash_table_t *hash_table_local;
  long value_local;
  unsigned_long hash_local;
  
  phVar3 = (hash_table_entry_t *)(hash % hash_table->capacity);
  phVar1 = hash_table->entries;
  entry = (hash_table_entry_t *)0x1;
  start_entry = phVar3;
  while( true ) {
    if (hash_table->entries[(long)start_entry].filled == 0) {
      phVar2 = hash_table->entries + (long)start_entry;
      phVar2->hash = hash;
      phVar2->filled = 1;
      phVar2->value = value;
      if (start_entry != phVar3) {
        phVar2->next = phVar1[(long)phVar3].next;
        phVar1[(long)phVar3].next = phVar2;
      }
      return 0;
    }
    if ((hash_table_entry_t *)hash_table->capacity <= entry) break;
    start_entry = (hash_table_entry_t *)
                  ((ulong)((long)&phVar3->hash + (long)entry * (long)entry) % hash_table->capacity);
    entry = (hash_table_entry_t *)((long)&entry->hash + 1);
  }
  return 1;
}

Assistant:

static int hash_table_insert_value(unsigned long hash, long value, hash_table_t* hash_table)
{
  /* Insert value */
  size_t start_index = hash % hash_table->capacity;
  size_t index = start_index;
  hash_table_entry_t* start_entry = hash_table->entries + start_index;
  size_t i;
  hash_table_entry_t* entry;

  for (i = 1; hash_table->entries[index].filled; i++)
  {
    if (i >= hash_table->capacity)
      return HASH_TABLE_ERROR;
    index = (start_index + (i * i)) % hash_table->capacity;
  }

  entry = hash_table->entries + index;
  entry->hash = hash;
  entry->filled = 1;
  entry->value = value;

  if (index != start_index) {
    /* This is a new entry, but not the start entry, hence we need to add a next pointer to our entry */
    entry->next = start_entry->next;
    start_entry->next = entry;
  }

  return HASH_TABLE_SUCCESS;
}